

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplex_test.cc
# Opt level: O2

void __thiscall
fizplex::SimplexTest_ThreeRowsThreeVarsOptimalSolution_Test::
SimplexTest_ThreeRowsThreeVarsOptimalSolution_Test
          (SimplexTest_ThreeRowsThreeVarsOptimalSolution_Test *this)

{
  SimplexTest::SimplexTest(&this->super_SimplexTest);
  (this->super_SimplexTest).super_Test._vptr_Test = (_func_int **)&PTR__SimplexTest_001c0bc0;
  return;
}

Assistant:

TEST_F(SimplexTest, ThreeRowsThreeVarsOptimalSolution) {
  lp.add_column(ColType::LowerBound, 0, inf, -1);
  lp.add_column(ColType::LowerBound, 0, inf, -2);
  lp.add_column(ColType::LowerBound, 0, inf, 3);
  lp.add_row(RowType::LE, -inf, 14, {2, 1, 1});
  lp.add_row(RowType::LE, -inf, 28, {4, 2, 3});
  lp.add_row(RowType::LE, -inf, 30, {2, 5, 5});

  solve_lp();
  EXPECT_EQ(Simplex::Result::OptimalSolution, result);
  EXPECT_DOUBLE_EQ(-13.0, z);
}